

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>::
write_decimal<int>(basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>_>_>
                   *this,int value)

{
  basic_buffer<wchar_t> *pbVar1;
  size_t sVar2;
  char *pcVar3;
  byte bVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  wchar_t *pwVar10;
  ulong uVar11;
  char_type buffer [13];
  char acStack_3d [13];
  
  uVar7 = (ulong)(uint)-value;
  if (0 < value) {
    uVar7 = (ulong)(uint)value;
  }
  uVar6 = (uint)uVar7;
  uVar8 = 0x1f;
  if ((uVar6 | 1) != 0) {
    for (; (uVar6 | 1) >> uVar8 == 0; uVar8 = uVar8 - 1) {
    }
  }
  uVar8 = (uVar8 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar9 = (ulong)((uVar8 - (uVar6 < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                             (ulong)uVar8 * 4))) + 1);
  pbVar1 = (this->out_).container;
  sVar2 = pbVar1->size_;
  uVar11 = ((uint)value >> 0x1f) + sVar2 + uVar9;
  if (pbVar1->capacity_ < uVar11) {
    (**pbVar1->_vptr_basic_buffer)(pbVar1,uVar11);
  }
  pwVar10 = pbVar1->ptr_ + sVar2;
  pbVar1->size_ = uVar11;
  if (value < 0) {
    *pwVar10 = L'-';
    pwVar10 = pwVar10 + 1;
  }
  pcVar3 = acStack_3d + uVar9;
  if (99 < uVar6) {
    do {
      uVar8 = (uint)uVar7;
      uVar6 = (uint)(uVar7 / 100);
      uVar7 = uVar7 / 100;
      *(undefined2 *)(pcVar3 + -2) =
           *(undefined2 *)
            (internal::basic_data<void>::DIGITS + (ulong)(uVar8 + (int)uVar7 * -100) * 2);
      pcVar3 = pcVar3 + -2;
    } while (9999 < uVar8);
  }
  if (uVar6 < 10) {
    bVar4 = (byte)uVar6 | 0x30;
    lVar5 = -1;
  }
  else {
    pcVar3[-1] = internal::basic_data<void>::DIGITS[((ulong)uVar6 * 2 & 0xffffffff) + 1];
    bVar4 = internal::basic_data<void>::DIGITS[(ulong)uVar6 * 2];
    lVar5 = -2;
  }
  pcVar3[lVar5] = bVar4;
  if (uVar9 != 0) {
    uVar7 = 0;
    do {
      pwVar10[uVar7] = (int)acStack_3d[uVar7];
      uVar7 = uVar7 + 1;
    } while (uVar9 != uVar7);
  }
  return;
}

Assistant:

void write_decimal(Int value) {
    typedef typename internal::int_traits<Int>::main_type main_type;
    main_type abs_value = static_cast<main_type>(value);
    bool is_negative = internal::is_negative(value);
    if (is_negative)
      abs_value = 0 - abs_value;
    int num_digits = internal::count_digits(abs_value);
    auto &&it = reserve((is_negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (is_negative)
      *it++ = static_cast<char_type>('-');
    it = internal::format_decimal<char_type>(it, abs_value, num_digits);
  }